

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O1

void __thiscall CDBWrapper::CDBWrapper(CDBWrapper *this,DBParams *params)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  Env **ppEVar1;
  ulong uVar2;
  LevelDBContext *pLVar3;
  pointer pcVar4;
  DB *pDVar5;
  pointer puVar6;
  bool bVar7;
  value_type *__val;
  _Head_base<0UL,_LevelDBContext_*,_false> __s;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar8;
  Logger *this_00;
  Env *pEVar9;
  long lVar10;
  pointer *__ptr;
  Options *pOVar11;
  Options *pOVar12;
  long in_FS_OFFSET;
  byte bVar13;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  Span<unsigned_char> bytes;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  undefined1 auVar14 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> new_key;
  Status status;
  Options options;
  path local_80;
  Status result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s._M_head_impl = (LevelDBContext *)operator_new(0x98);
  memset(__s._M_head_impl,0,0x98);
  leveldb::Options::Options(&(__s._M_head_impl)->options);
  ((__s._M_head_impl)->readoptions).verify_checksums = false;
  ((__s._M_head_impl)->readoptions).fill_cache = true;
  ((__s._M_head_impl)->readoptions).snapshot = (Snapshot *)0x0;
  ((__s._M_head_impl)->iteroptions).verify_checksums = false;
  ((__s._M_head_impl)->iteroptions).fill_cache = true;
  ((__s._M_head_impl)->iteroptions).snapshot = (Snapshot *)0x0;
  (__s._M_head_impl)->writeoptions = false;
  (__s._M_head_impl)->syncoptions = false;
  (this->m_db_context)._M_t.
  super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
  super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl = __s._M_head_impl;
  auVar14 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar14._8_8_ == 0 ||
      auVar14._0_8_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::filesystem::__cxx11::path::path(&local_80);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
               auVar14._0_8_,0,auVar14._8_8_);
    std::filesystem::__cxx11::path::path(&local_80,(string_type *)&result,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(result.state_._4_4_,(int)result.state_) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(result.state_._4_4_,(int)result.state_),
                      local_48._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path((path *)&options,&local_80);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_name,options.comparator,
             (long)&(options.comparator)->_vptr_Comparator + options._8_8_);
  std::filesystem::__cxx11::path::~path((path *)&options);
  std::filesystem::__cxx11::path::~path(&local_80);
  value = &this->obfuscate_key;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::path::path(&(this->m_path).super_path,(path *)params);
  this->m_is_memory = params->memory_only;
  puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  ((puVar8->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
   super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
   super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv = (Env *)0x0;
  puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar8->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->readoptions).verify_checksums =
       true;
  puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar8->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->iteroptions).verify_checksums =
       true;
  puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar8->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->iteroptions).fill_cache = false;
  puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar8->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->syncoptions).sync = true;
  uVar2 = params->cache_bytes;
  leveldb::Options::Options(&options);
  options.block_cache = leveldb::NewLRUCache(uVar2 >> 1);
  options.write_buffer_size = uVar2 >> 2;
  options.filter_policy = leveldb::NewBloomFilterPolicy(10);
  options.compression = kNoCompression;
  options.info_log = (Logger *)operator_new(8);
  (options.info_log)->_vptr_Logger = (_func_int **)&PTR__Logger_00b14818;
  options.paranoid_checks = true;
  result.state_._0_4_ = options.max_open_files;
  this_00 = LogInstance();
  bVar7 = BCLog::Logger::WillLogCategoryLevel(this_00,LEVELDB,Debug);
  if (bVar7) {
    logging_function._M_str = "SetMaxOpenFiles";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file._M_len = 0x5d;
    LogPrintFormatInternal<int,int>
              (logging_function,source_file,0x86,LEVELDB,Debug,(ConstevalFormatString<2U>)0x82a599,
               &options.max_open_files,(int *)&result);
  }
  puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pOVar11 = &options;
  pOVar12 = &((puVar8->_M_t).
              super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
              super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
              super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options;
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    pOVar12->comparator = pOVar11->comparator;
    pOVar11 = (Options *)((long)pOVar11 + (ulong)bVar13 * -0x10 + 8);
    pOVar12 = (Options *)((long)pOVar12 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  (((puVar8->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
    super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
    super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).create_if_missing = true;
  if (params->memory_only == true) {
    pEVar9 = leveldb::Env::Default();
    pEVar9 = leveldb::NewMemEnv(pEVar9);
    puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    ((puVar8->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t
     .super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
     super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv = pEVar9;
    puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    pEVar9 = ((puVar8->_M_t).
              super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
              super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
              super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->penv;
    puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    (((puVar8->_M_t).super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>.
      _M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
      super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options).env = pEVar9;
  }
  else {
    ppEVar1 = &options.env;
    if (params->wipe_data == true) {
      pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
      options.comparator = (Comparator *)ppEVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&options,pcVar4,
                 pcVar4 + (params->path).super_path._M_pathname._M_string_length);
      logging_function_00._M_str = "CDBWrapper";
      logging_function_00._M_len = 10;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
      ;
      source_file_00._M_len = 0x5d;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_00,source_file_00,0xec,ALL,Info,
                 (ConstevalFormatString<1U>)0x82a309,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options);
      if (options.comparator != (Comparator *)ppEVar1) {
        operator_delete(options.comparator,(ulong)((long)&(options.env)->_vptr_Env + 1));
      }
      pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
      options.comparator = (Comparator *)ppEVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&options,pcVar4,
                 pcVar4 + (params->path).super_path._M_pathname._M_string_length);
      puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                         (&this->m_db_context,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                          ,0xd3,"DBContext","m_db_context");
      leveldb::DestroyDB((leveldb *)&result,(string *)&options,
                         &((puVar8->_M_t).
                           super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>
                           .super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->options);
      if (options.comparator != (Comparator *)ppEVar1) {
        operator_delete(options.comparator,(ulong)((long)&(options.env)->_vptr_Env + 1));
      }
      HandleError(&result);
      if ((void *)CONCAT44(result.state_._4_4_,(int)result.state_) != (void *)0x0) {
        operator_delete__((void *)CONCAT44(result.state_._4_4_,(int)result.state_));
      }
    }
    TryCreateDirectories(&params->path);
    pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
    options.comparator = (Comparator *)ppEVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&options,pcVar4,
               pcVar4 + (params->path).super_path._M_pathname._M_string_length);
    logging_function_01._M_str = "CDBWrapper";
    logging_function_01._M_len = 10;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file_01._M_len = 0x5d;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_01,source_file_01,0xf1,ALL,Info,(ConstevalFormatString<1U>)0x82a31f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options);
    if (options.comparator != (Comparator *)ppEVar1) {
      operator_delete(options.comparator,(ulong)((long)&(options.env)->_vptr_Env + 1));
    }
  }
  puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pLVar3 = (puVar8->_M_t).
           super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
           super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
           super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl;
  pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
  ppEVar1 = &options.env;
  options.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options,pcVar4,
             pcVar4 + (params->path).super_path._M_pathname._M_string_length);
  puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  leveldb::DB::Open((DB *)&status,&pLVar3->options,(string *)&options,
                    &((puVar8->_M_t).
                      super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>
                      .super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb);
  if (options.comparator != (Comparator *)ppEVar1) {
    operator_delete(options.comparator,(ulong)((long)&(options.env)->_vptr_Env + 1));
  }
  HandleError(&status);
  logging_function_02._M_str = "CDBWrapper";
  logging_function_02._M_len = 10;
  source_file_02._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
  ;
  source_file_02._M_len = 0x5d;
  LogPrintFormatInternal<>
            (logging_function_02,source_file_02,0xf9,ALL,Info,(ConstevalFormatString<0U>)0x82a336);
  if ((params->options).force_compact == true) {
    pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
    options.comparator = (Comparator *)ppEVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&options,pcVar4,
               pcVar4 + (params->path).super_path._M_pathname._M_string_length);
    logging_function_03._M_str = "CDBWrapper";
    logging_function_03._M_len = 10;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file_03._M_len = 0x5d;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_03,source_file_03,0xfc,ALL,Info,(ConstevalFormatString<1U>)0x82a353,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options);
    if (options.comparator != (Comparator *)ppEVar1) {
      operator_delete(options.comparator,(ulong)((long)&(options.env)->_vptr_Env + 1));
    }
    puVar8 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                       (&this->m_db_context,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                        ,0xd3,"DBContext","m_db_context");
    pDVar5 = ((puVar8->_M_t).
              super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
              super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
              super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
    (*pDVar5->_vptr_DB[0xb])(pDVar5,0,0);
    pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
    options.comparator = (Comparator *)ppEVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&options,pcVar4,
               pcVar4 + (params->path).super_path._M_pathname._M_string_length);
    logging_function_04._M_str = "CDBWrapper";
    logging_function_04._M_len = 10;
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
    ;
    source_file_04._M_len = 0x5d;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_04,source_file_04,0xfe,ALL,Info,(ConstevalFormatString<1U>)0x82a377,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options);
    if (options.comparator != (Comparator *)ppEVar1) {
      operator_delete(options.comparator,(ulong)((long)&(options.env)->_vptr_Env + 1));
    }
  }
  options.comparator = (Comparator *)0x0;
  options.create_if_missing = false;
  options.error_if_exists = false;
  options.paranoid_checks = false;
  options._11_5_ = 0;
  options.env = (Env *)0x0;
  options.comparator = (Comparator *)operator_new(8);
  options._8_8_ = options.comparator + 1;
  (options.comparator)->_vptr_Comparator = (_func_int **)0x0;
  options.env = (Env *)options._8_8_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(value,&options);
  if (options.comparator != (Comparator *)0x0) {
    operator_delete(options.comparator,(long)options.env - (long)options.comparator);
  }
  bVar7 = Read<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,value);
  if ((!bVar7) && (params->obfuscate == true)) {
    bVar7 = IsEmpty(this);
    if (bVar7) {
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(8);
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 8;
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0] = '\0';
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[1] = '\0';
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[2] = '\0';
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[3] = '\0';
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[4] = '\0';
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[5] = '\0';
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[6] = '\0';
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[7] = '\0';
      bytes.m_size = 8;
      bytes.m_data = new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      GetRandBytes(bytes);
      Write<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (this,&OBFUSCATE_KEY_KEY_abi_cxx11_,&new_key,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(value,&new_key);
      pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
      options.comparator = (Comparator *)ppEVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&options,pcVar4,
                 pcVar4 + (params->path).super_path._M_pathname._M_string_length);
      puVar6 = (this->obfuscate_key).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      s.m_size = (long)(this->obfuscate_key).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar6;
      s.m_data = puVar6;
      HexStr_abi_cxx11_((string *)&result,s);
      logging_function_05._M_str = "CDBWrapper";
      logging_function_05._M_len = 10;
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
      ;
      source_file_05._M_len = 0x5d;
      LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                (logging_function_05,source_file_05,0x10f,ALL,Info,
                 (ConstevalFormatString<2U>)0x82a39b,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options,
                 (string *)&result);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(result.state_._4_4_,(int)result.state_) != &local_48) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(result.state_._4_4_,(int)result.state_),
                        local_48._M_allocated_capacity + 1);
      }
      if (options.comparator != (Comparator *)ppEVar1) {
        operator_delete(options.comparator,(ulong)((long)&(options.env)->_vptr_Env + 1));
      }
      if (new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(new_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)new_key.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)new_key.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  pcVar4 = (params->path).super_path._M_pathname._M_dataplus._M_p;
  options.comparator = (Comparator *)ppEVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options,pcVar4,
             pcVar4 + (params->path).super_path._M_pathname._M_string_length);
  puVar6 = (this->obfuscate_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  s_00.m_size = (long)(this->obfuscate_key).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar6;
  s_00.m_data = puVar6;
  HexStr_abi_cxx11_((string *)&result,s_00);
  logging_function_06._M_str = "CDBWrapper";
  logging_function_06._M_len = 10;
  source_file_06._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
  ;
  source_file_06._M_len = 0x5d;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_06,source_file_06,0x112,ALL,Info,(ConstevalFormatString<2U>)0x82a3bf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&options,
             (string *)&result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(result.state_._4_4_,(int)result.state_) != &local_48) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(result.state_._4_4_,(int)result.state_),
                    local_48._M_allocated_capacity + 1);
  }
  if (options.comparator != (Comparator *)ppEVar1) {
    operator_delete(options.comparator,(ulong)((long)&(options.env)->_vptr_Env + 1));
  }
  if (status.state_ != (char *)0x0) {
    operator_delete__(status.state_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBWrapper::CDBWrapper(const DBParams& params)
    : m_db_context{std::make_unique<LevelDBContext>()}, m_name{fs::PathToString(params.path.stem())}, m_path{params.path}, m_is_memory{params.memory_only}
{
    DBContext().penv = nullptr;
    DBContext().readoptions.verify_checksums = true;
    DBContext().iteroptions.verify_checksums = true;
    DBContext().iteroptions.fill_cache = false;
    DBContext().syncoptions.sync = true;
    DBContext().options = GetOptions(params.cache_bytes);
    DBContext().options.create_if_missing = true;
    if (params.memory_only) {
        DBContext().penv = leveldb::NewMemEnv(leveldb::Env::Default());
        DBContext().options.env = DBContext().penv;
    } else {
        if (params.wipe_data) {
            LogPrintf("Wiping LevelDB in %s\n", fs::PathToString(params.path));
            leveldb::Status result = leveldb::DestroyDB(fs::PathToString(params.path), DBContext().options);
            HandleError(result);
        }
        TryCreateDirectories(params.path);
        LogPrintf("Opening LevelDB in %s\n", fs::PathToString(params.path));
    }
    // PathToString() return value is safe to pass to leveldb open function,
    // because on POSIX leveldb passes the byte string directly to ::open(), and
    // on Windows it converts from UTF-8 to UTF-16 before calling ::CreateFileW
    // (see env_posix.cc and env_windows.cc).
    leveldb::Status status = leveldb::DB::Open(DBContext().options, fs::PathToString(params.path), &DBContext().pdb);
    HandleError(status);
    LogPrintf("Opened LevelDB successfully\n");

    if (params.options.force_compact) {
        LogPrintf("Starting database compaction of %s\n", fs::PathToString(params.path));
        DBContext().pdb->CompactRange(nullptr, nullptr);
        LogPrintf("Finished database compaction of %s\n", fs::PathToString(params.path));
    }

    // The base-case obfuscation key, which is a noop.
    obfuscate_key = std::vector<unsigned char>(OBFUSCATE_KEY_NUM_BYTES, '\000');

    bool key_exists = Read(OBFUSCATE_KEY_KEY, obfuscate_key);

    if (!key_exists && params.obfuscate && IsEmpty()) {
        // Initialize non-degenerate obfuscation if it won't upset
        // existing, non-obfuscated data.
        std::vector<unsigned char> new_key = CreateObfuscateKey();

        // Write `new_key` so we don't obfuscate the key with itself
        Write(OBFUSCATE_KEY_KEY, new_key);
        obfuscate_key = new_key;

        LogPrintf("Wrote new obfuscate key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
    }

    LogPrintf("Using obfuscation key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
}